

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription
          (storage_t *this,mbox_t *mbox,type_index *msg_type,state_t *target_state)

{
  is_same_mbox_msg __pred;
  bool bVar1;
  int iVar2;
  abstract_message_box_t *paVar3;
  undefined4 extraout_var;
  iterator __first;
  iterator __last;
  agent_t *paVar4;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  local_60;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  local_58;
  subscr_info_t *local_50;
  const_iterator local_48;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  local_40;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  local_38;
  iterator existed_position;
  mbox_id_t mbox_id;
  state_t *target_state_local;
  type_index *msg_type_local;
  mbox_t *mbox_local;
  storage_t *this_local;
  
  paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
  iVar2 = (*paVar3->_vptr_abstract_message_box_t[2])();
  existed_position._M_current = (subscr_info_t *)CONCAT44(extraout_var,iVar2);
  local_38._M_current =
       (subscr_info_t *)
       vector_based_subscr_storage::(anonymous_namespace)::
       find<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                 (&this->m_events,(mbox_id_t *)&existed_position,msg_type,target_state);
  local_40._M_current =
       (subscr_info_t *)
       std::
       vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
       ::end(&this->m_events);
  bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_const*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
    ::__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t*>
              ((__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_const*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                *)&local_48,&local_38);
    local_50 = (subscr_info_t *)
               std::
               vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
               ::erase(&this->m_events,local_48);
    local_58._M_current =
         (subscr_info_t *)
         std::
         end<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                   (&this->m_events);
    __first = std::
              begin<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                        (&this->m_events);
    __last = std::
             end<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                       (&this->m_events);
    __pred.m_type = msg_type;
    __pred.m_id = (mbox_id_t)existed_position._M_current;
    local_60 = std::
               find_if<__gnu_cxx::__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>,so_5::impl::vector_based_subscr_storage::storage_t::is_same_mbox_msg>
                         (__first._M_current,__last._M_current,__pred);
    bVar1 = __gnu_cxx::operator==(&local_58,&local_60);
    if (bVar1) {
      paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
      paVar4 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (*paVar3->_vptr_abstract_message_box_t[4])(paVar3,msg_type,paVar4);
    }
  }
  return;
}

Assistant:

void
storage_t::drop_subscription(
	const mbox_t & mbox,
	const std::type_index & msg_type,
	const state_t & target_state )
	{
		using namespace std;

		const auto mbox_id = mbox->id();

		auto existed_position = find(
				m_events, mbox_id, msg_type, target_state );
		if( existed_position != m_events.end() )
			{
				m_events.erase( existed_position );

				// Note v.5.5.9 unsubscribe_event_handlers is called for
				// mbox even if it is MPSC mbox. It is necessary for the case
				// of message delivery tracing.

				// If there is no more subscriptions to that mbox then
				// the mbox must remove information about that agent.
				if( end( m_events ) == find_if(
						begin( m_events ), end( m_events ),
						is_same_mbox_msg{ mbox_id, msg_type } ) )
					{
						// If we are here then there is no more references
						// to the mbox. And mbox must not hold reference
						// to the agent.
						mbox->unsubscribe_event_handlers( msg_type, owner() );
					}
			}
	}